

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int __thiscall xmrig::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char *pcVar1;
  
  if ((this->m_size == 0) || (this->m_size != *(size_t *)(dst + 8))) {
    if (this->m_data != (char *)0x0) {
      operator_delete__(this->m_data);
    }
    if (*(long *)dst == 0) {
      this->m_size = 0;
      this->m_data = (char *)0x0;
    }
    else {
      this->m_size = *(size_t *)(dst + 8);
      pcVar1 = (char *)operator_new__(this->m_size + 1);
      this->m_data = pcVar1;
      this = (String *)memcpy(this->m_data,*(void **)dst,this->m_size + 1);
    }
  }
  else {
    this = (String *)memcpy(this->m_data,*(void **)dst,this->m_size + 1);
  }
  return (int)this;
}

Assistant:

void xmrig::String::copy(const String &other)
{
    if (m_size > 0 && m_size == other.m_size) {
        memcpy(m_data, other.m_data, m_size + 1);

        return;
    }

    delete [] m_data;

    if (other.m_data == nullptr) {
        m_size = 0;
        m_data = nullptr;

        return;
    }

    m_size = other.m_size;
    m_data = new char[m_size + 1];

    memcpy(m_data, other.m_data, m_size + 1);
}